

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O1

int trico_skip_next_stream(void *a)

{
  int iVar1;
  
  switch(*(undefined4 *)((long)a + 0x24)) {
  case 0:
    return 1;
  case 1:
    iVar1 = trico_read_vec3_float(a,(float **)0x0,trico_vertex_float_stream);
    return iVar1;
  case 2:
    iVar1 = trico_read_vec3_double(a,(double **)0x0,trico_vertex_double_stream);
    return iVar1;
  case 3:
    iVar1 = trico_read_triangles(a,(uint32_t **)0x0);
    return iVar1;
  case 4:
    iVar1 = trico_read_triangles_long(a,(uint64_t **)0x0);
    return iVar1;
  case 5:
    iVar1 = trico_read_vec2_float(a,(float **)0x0,trico_uv_per_vertex_float_stream);
    return iVar1;
  case 6:
    iVar1 = trico_read_vec2_double(a,(double **)0x0,trico_uv_per_vertex_double_stream);
    return iVar1;
  case 7:
    iVar1 = trico_read_vec2_float(a,(float **)0x0,trico_uv_per_triangle_float_stream);
    return iVar1;
  case 8:
    iVar1 = trico_read_vec2_double(a,(double **)0x0,trico_uv_per_triangle_double_stream);
    return iVar1;
  case 9:
    iVar1 = trico_read_vec3_float(a,(float **)0x0,trico_vertex_normal_float_stream);
    return iVar1;
  case 10:
    iVar1 = trico_read_vec3_double(a,(double **)0x0,trico_vertex_normal_double_stream);
    return iVar1;
  case 0xb:
    iVar1 = trico_read_vec3_float(a,(float **)0x0,trico_triangle_normal_float_stream);
    return iVar1;
  case 0xc:
    iVar1 = trico_read_vec3_double(a,(double **)0x0,trico_triangle_normal_double_stream);
    return iVar1;
  case 0xd:
    iVar1 = trico_read_uint32(a,(uint32_t **)0x0,trico_vertex_color_stream);
    return iVar1;
  case 0xe:
    iVar1 = trico_read_uint32(a,(uint32_t **)0x0,trico_triangle_color_stream);
    return iVar1;
  case 0xf:
    iVar1 = trico_read_attributes_float(a,(float **)0x0);
    return iVar1;
  case 0x10:
    iVar1 = trico_read_attributes_double(a,(double **)0x0);
    return iVar1;
  case 0x11:
    iVar1 = trico_read_attributes_uint8(a,(uint8_t **)0x0);
    return iVar1;
  case 0x12:
    iVar1 = trico_read_attributes_uint16(a,(uint16_t **)0x0);
    return iVar1;
  case 0x13:
    iVar1 = trico_read_uint32(a,(uint32_t **)0x0,trico_attribute_uint32_stream);
    return iVar1;
  case 0x14:
    iVar1 = trico_read_attributes_uint64(a,(uint64_t **)0x0);
    return iVar1;
  default:
    return 0;
  }
}

Assistant:

int trico_skip_next_stream(void* a)
    {
    struct trico_archive* arch = (struct trico_archive*)a;
    enum trico_stream_type st = trico_get_next_stream_type(arch);
    switch (st)
      {
      case trico_empty: return 1;
      case trico_vertex_float_stream: return trico_read_vertices(arch, NULL);
      case trico_vertex_double_stream: return trico_read_vertices_double(arch, NULL);
      case trico_triangle_uint32_stream: return trico_read_triangles(arch, NULL);
      case trico_triangle_uint64_stream: return trico_read_triangles_long(arch, NULL);
      case trico_uv_per_vertex_float_stream: return trico_read_uv_per_vertex(arch, NULL);
      case trico_uv_per_vertex_double_stream: return trico_read_uv_per_vertex_double(arch, NULL);
      case trico_uv_per_triangle_float_stream: return trico_read_uv_per_triangle(arch, NULL);
      case trico_uv_per_triangle_double_stream: return trico_read_uv_per_triangle_double(arch, NULL);
      case trico_vertex_normal_float_stream: return trico_read_vertex_normals(arch, NULL);
      case trico_vertex_normal_double_stream: return trico_read_vertex_normals_double(arch, NULL);
      case trico_triangle_normal_float_stream: return trico_read_triangle_normals(arch, NULL);
      case trico_vertex_color_stream: return trico_read_vertex_colors(arch, NULL);
      case trico_triangle_color_stream: return trico_read_triangle_colors(arch, NULL);
      case trico_triangle_normal_double_stream: return trico_read_triangle_normals_double(arch, NULL);
      case trico_attribute_float_stream: return trico_read_attributes_float(arch, NULL);
      case trico_attribute_double_stream: return trico_read_attributes_double(arch, NULL);
      case trico_attribute_uint8_stream: return trico_read_attributes_uint8(arch, NULL);
      case trico_attribute_uint16_stream: return trico_read_attributes_uint16(arch, NULL);
      case trico_attribute_uint32_stream: return trico_read_attributes_uint32(arch, NULL);
      case trico_attribute_uint64_stream: return trico_read_attributes_uint64(arch, NULL);
      }
    return 0;
    }